

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O2

int mem_query(lua_State *L)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  char *__s1;
  long lVar4;
  
  iVar1 = lua_type(L,1);
  if (iVar1 == -1) {
    lua_pushinteger(L,l_memcontrol.total);
    lua_pushinteger(L,l_memcontrol.numblocks);
    lua_pushinteger(L,l_memcontrol.maxmem);
    iVar1 = 3;
  }
  else {
    iVar1 = lua_isnumber(L,1);
    if (iVar1 == 0) {
      iVar1 = 1;
      __s1 = luaL_checklstring(L,1,(size_t *)0x0);
      lVar4 = 9;
      while( true ) {
        if ((int)lVar4 + -1 < 0) {
          iVar1 = luaL_error(L,"unknown type \'%s\'",__s1);
          return iVar1;
        }
        iVar2 = strcmp(__s1,luaT_typenames_[lVar4]);
        if (iVar2 == 0) break;
        lVar4 = lVar4 + -1;
      }
      lua_pushinteger(L,l_memcontrol.objcount[(int)lVar4 - 1]);
    }
    else {
      uVar3 = luaL_checkinteger(L,1);
      iVar1 = 0;
      l_memcontrol.memlimit = -(ulong)(uVar3 == 0) | uVar3;
    }
  }
  return iVar1;
}

Assistant:

static int mem_query (lua_State *L) {
  if (lua_isnone(L, 1)) {
    lua_pushinteger(L, l_memcontrol.total);
    lua_pushinteger(L, l_memcontrol.numblocks);
    lua_pushinteger(L, l_memcontrol.maxmem);
    return 3;
  }
  else if (lua_isnumber(L, 1)) {
    unsigned long limit = cast(unsigned long, luaL_checkinteger(L, 1));
    if (limit == 0) limit = ULONG_MAX;
    l_memcontrol.memlimit = limit;
    return 0;
  }
  else {
    const char *t = luaL_checkstring(L, 1);
    int i;
    for (i = LUA_NUMTAGS - 1; i >= 0; i--) {
      if (strcmp(t, ttypename(i)) == 0) {
        lua_pushinteger(L, l_memcontrol.objcount[i]);
        return 1;
      }
    }
    return luaL_error(L, "unknown type '%s'", t);
  }
}